

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

bool __thiscall tinyusdz::Path::is_root_prim(Path *this)

{
  long lVar1;
  
  if (((this->_valid == true) &&
      ((((this->_prim_part)._M_string_length != 1 || (*(this->_prim_part)._M_dataplus._M_p != '/'))
       && (1 < (this->_prim_part)._M_string_length)))) &&
     (*(this->_prim_part)._M_dataplus._M_p == '/')) {
    lVar1 = ::std::__cxx11::string::rfind((char)this,0x2f);
    if (lVar1 == 0) {
      return true;
    }
  }
  return false;
}

Assistant:

bool is_root_prim() const {
    if (!_valid) {
      return false;
    }

    if (is_root_path()) {
      return false;
    }

    if ((_prim_part.size() > 1) && (_prim_part[0] == '/')) {
      // no other '/' except for the fist one
      if (_prim_part.find_last_of('/') == 0) {
        return true;
      }
    }

    return false;
  }